

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

bool __thiscall helics::CommonCore::waitCoreRegistration(CommonCore *this)

{
  BrokerBase *this_00;
  pointer pcVar1;
  long lVar2;
  string_view message;
  string_view message_00;
  string_view message_01;
  int iVar3;
  int *piVar4;
  socklen_t __len;
  long in_RCX;
  size_type sVar5;
  sockaddr *in_RDX;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *extraout_RDX_02;
  int __fd;
  ActionMessage *in_RSI;
  ulong uVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  int iVar7;
  ulong uVar8;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view fmt;
  format_args args;
  ActionMessage resend;
  string local_138;
  undefined8 local_118;
  char *pcStack_110;
  undefined8 local_108;
  char *pcStack_100;
  size_t local_f8;
  char *pcStack_f0;
  ActionMessage local_e8;
  
  this_00 = &this->super_BrokerBase;
  iVar3 = (this->super_BrokerBase).global_id._M_i.gid;
  uVar8 = 0;
  do {
    __fd = (int)in_RSI;
    __len = (socklen_t)in_RCX;
    if (((iVar3 != -2010000000) && (iVar3 != 0)) && (iVar3 != -1700000000)) {
      return true;
    }
    iVar7 = (int)uVar8;
    if (6 < uVar8) {
      pcVar1 = (this->super_BrokerBase).identifier._M_dataplus._M_p;
      sVar5 = (this->super_BrokerBase).identifier._M_string_length;
      local_e8.messageAction = (int)(this->super_BrokerBase).brokerState._M_i;
      fmt.size_ = 0x111;
      fmt.data_ = (char *)0x2a;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)&local_e8;
      local_e8.dest_id.gid = iVar3;
      local_e8.actionTime.internalTimeCode._0_4_ = iVar7;
      ::fmt::v11::vformat_abi_cxx11_
                (&local_138,(v11 *)"broker state={}, broker id={}, sleepcnt={}",fmt,args);
      local_f8 = local_138._M_string_length;
      pcStack_f0 = local_138._M_dataplus._M_p;
      __fd = 0;
      in_R9.values_ = (value<fmt::v11::context> *)0x0;
      message._M_str = local_138._M_dataplus._M_p;
      message._M_len = local_138._M_string_length;
      name._M_str = pcVar1;
      name._M_len = sVar5;
      BrokerBase::sendToLogger(this_00,(GlobalFederateId)0x0,3,name,message,false);
      __len = (socklen_t)sVar5;
      in_RDX = extraout_RDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        uVar6 = local_138.field_2._M_allocated_capacity + 1;
        operator_delete(local_138._M_dataplus._M_p,uVar6);
        __fd = (int)uVar6;
        in_RDX = extraout_RDX_00;
      }
    }
    if ((this->super_BrokerBase).brokerState._M_i < ~TERMINATING) {
      connect(this,__fd,in_RDX,__len);
    }
    if (CONNECTED_ERROR < (this->super_BrokerBase).brokerState._M_i) {
      return false;
    }
    if (iVar7 == 0x14) {
      local_118 = 0x15;
      pcStack_110 = "resending reg message";
      in_R9.values_ = (value<fmt::v11::context> *)0x0;
      message_01._M_str = "resending reg message";
      message_01._M_len = 0x15;
      name_01._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
      name_01._M_len = (this->super_BrokerBase).identifier._M_string_length;
      BrokerBase::sendToLogger(this_00,(GlobalFederateId)0x0,3,name_01,message_01,false);
      ActionMessage::ActionMessage(&local_e8,cmd_resend);
      local_e8.messageID = -0x10000028;
      BrokerBase::addActionMessage(this_00,&local_e8);
      ActionMessage::~ActionMessage(&local_e8);
    }
    else if (iVar7 == 4) {
      local_108 = 0x41;
      pcStack_100 = "now waiting for the core to finish registration before proceeding";
      in_R9.values_ = (value<fmt::v11::context> *)0x0;
      message_00._M_str = "now waiting for the core to finish registration before proceeding";
      message_00._M_len = 0x41;
      name_00._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
      name_00._M_len = (this->super_BrokerBase).identifier._M_string_length;
      BrokerBase::sendToLogger(this_00,(GlobalFederateId)0x0,3,name_00,message_00,false);
    }
    local_e8.messageAction = cmd_ignore;
    local_e8.messageID = 0;
    local_e8.source_id.gid = 100000000;
    local_e8.source_handle.hid = 0;
    do {
      in_RSI = &local_e8;
      iVar3 = nanosleep((timespec *)&local_e8,(timespec *)&local_e8);
      in_RDX = extraout_RDX_01;
      if (iVar3 != -1) break;
      piVar4 = __errno_location();
      in_RDX = extraout_RDX_02;
    } while (*piVar4 == 4);
    iVar3 = (this->super_BrokerBase).global_id._M_i.gid;
    uVar8 = uVar8 + 1;
    in_RCX = uVar8 * 100000000;
    lVar2 = (this->super_BrokerBase).timeout.internalTimeCode;
    if (in_RCX - lVar2 != 0 && lVar2 <= in_RCX) {
      return false;
    }
  } while( true );
}

Assistant:

bool CommonCore::waitCoreRegistration()
{
    int sleepcnt = 0;
    auto brkid = global_id.load();
    while ((brkid == parent_broker_id) || (!brkid.isValid())) {
        if (sleepcnt > 6) {
            LOG_WARNING(parent_broker_id,
                        identifier,
                        fmt::format("broker state={}, broker id={}, sleepcnt={}",
                                    static_cast<int>(getBrokerState()),
                                    brkid.baseValue(),
                                    sleepcnt));
        }
        if (getBrokerState() <= BrokerState::CONFIGURED) {
            connect();
        }
        if (getBrokerState() >= BrokerState::TERMINATING) {
            return false;
        }
        if (sleepcnt == 4) {
            LOG_WARNING(parent_broker_id,
                        identifier,
                        "now waiting for the core to finish registration before proceeding");
        }
        if (sleepcnt == 20) {
            LOG_WARNING(parent_broker_id, identifier, "resending reg message");
            ActionMessage resend(CMD_RESEND);
            resend.messageID = static_cast<int32_t>(CMD_REG_BROKER);
            addActionMessage(resend);
        }
        std::this_thread::sleep_for(std::chrono::milliseconds(100));
        brkid = global_id.load();
        ++sleepcnt;
        if (Time(static_cast<int64_t>(sleepcnt) * 100, time_units::ms) > timeout) {
            return false;
        }
    }
    return true;
}